

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  uint __val;
  _func_int **pp_Var1;
  undefined8 uVar2;
  char cVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int *piVar7;
  size_t sVar8;
  istream *piVar9;
  ulong uVar10;
  long lVar11;
  FILE *pFVar12;
  long lVar13;
  ostream *poVar14;
  uint uVar15;
  long *plVar16;
  char *pcVar17;
  undefined4 in_register_0000003c;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  double dVar18;
  undefined8 uVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  string line;
  DBSQLite db;
  vector<Tle,_std::allocator<Tle>_> results;
  SatLookAngles TLEsAndLAs;
  char local_329;
  string local_328;
  FILE *local_308;
  FILE *local_300;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [16];
  DisplayNCurses local_2c0;
  undefined1 local_2b0;
  undefined7 uStack_2af;
  long local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  ulong local_288;
  ulong local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined8 local_268;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [24];
  vector<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
  local_220 [20];
  
  iVar6 = getopt_long(CONCAT44(in_register_0000003c,argc),argv,"ghva:d:r:u:x:y:",opts,0);
  if (iVar6 < 1) {
    local_300 = (FILE *)0x0;
    local_258._0_8_ = 0.0;
    local_258._8_8_ = 0;
    local_2d8._0_8_ = 0.0;
    local_2d8._8_8_ = 0;
    local_280 = 0;
    local_288 = 0;
    local_248 = ZEXT816(0);
    pFVar12 = (FILE *)"./.satnow.sql3";
    lVar11 = 0xffffffff;
  }
  else {
    local_308 = (FILE *)0x115158;
    local_248 = ZEXT816(0);
    local_2a0 = 0xffffffff;
    local_300 = (FILE *)0x0;
    local_288 = 0;
    local_280 = 0;
    local_258 = ZEXT816(0);
    dVar18 = 0.0;
    uVar19 = 0;
    do {
      if (iVar6 - 0x72U < 8) {
        switch(iVar6) {
        case 0x72:
          local_2d8._8_8_ = uVar19;
          local_2d8._0_8_ = dVar18;
          std::__cxx11::string::string((string *)local_238,(char *)_optarg,(allocator *)&local_328);
          pp_Var1 = (_func_int **)CONCAT71(local_238._1_7_,local_238[0]);
          piVar7 = __errno_location();
          iVar6 = *piVar7;
          *piVar7 = 0;
          lVar11 = strtol((char *)pp_Var1,(char **)&local_2c0,10);
          if (local_2c0.super_Display._vptr_Display != pp_Var1) {
            local_2a0 = lVar11;
            if (((int)lVar11 == lVar11) && (*piVar7 != 0x22)) {
              if (*piVar7 == 0) goto LAB_001080e5;
              goto LAB_001080e8;
            }
LAB_00108cb2:
            std::__throw_out_of_range("stoi");
          }
          std::__throw_invalid_argument("stoi");
LAB_00108cca:
          std::__throw_invalid_argument("stod");
LAB_00108cd6:
          poVar14 = std::operator<<((ostream *)&std::cerr,"[-] Unknown command line option.");
          std::endl<char,std::char_traits<char>>(poVar14);
          exit(1);
        default:
          goto LAB_00108cd6;
        case 0x75:
          local_2d8._8_8_ = uVar19;
          local_2d8._0_8_ = dVar18;
          local_300 = _optarg;
          break;
        case 0x76:
          local_2d8._8_8_ = uVar19;
          local_2d8._0_8_ = dVar18;
          local_280 = CONCAT71((int7)((ulong)(&DAT_00115060 +
                                             *(int *)(&DAT_00115060 + (ulong)(iVar6 - 0x72U) * 4))
                                     >> 8),1);
          break;
        case 0x78:
          local_2d8._8_8_ = uVar19;
          local_2d8._0_8_ = dVar18;
          std::__cxx11::string::string((string *)local_238,(char *)_optarg,(allocator *)&local_328);
          pp_Var1 = (_func_int **)CONCAT71(local_238._1_7_,local_238[0]);
          piVar7 = __errno_location();
          iVar6 = *piVar7;
          *piVar7 = 0;
          dVar18 = strtod((char *)pp_Var1,(char **)&local_2c0);
          if (local_2c0.super_Display._vptr_Display == pp_Var1) {
LAB_00108ca6:
            std::__throw_invalid_argument("stod");
            goto LAB_00108cb2;
          }
          local_258._8_4_ = extraout_XMM0_Dc_01;
          local_258._0_8_ = dVar18;
          local_258._12_4_ = extraout_XMM0_Dd_01;
          if (*piVar7 == 0) {
LAB_001080e5:
            *piVar7 = iVar6;
          }
          else if (*piVar7 == 0x22) {
LAB_00108d07:
            std::__throw_out_of_range("stod");
            goto LAB_00108d13;
          }
          goto LAB_001080e8;
        case 0x79:
          std::__cxx11::string::string((string *)local_238,(char *)_optarg,(allocator *)&local_328);
          pp_Var1 = (_func_int **)CONCAT71(local_238._1_7_,local_238[0]);
          piVar7 = __errno_location();
          iVar6 = *piVar7;
          *piVar7 = 0;
          dVar18 = strtod((char *)pp_Var1,(char **)&local_2c0);
          if (local_2c0.super_Display._vptr_Display == pp_Var1) {
            std::__throw_invalid_argument("stod");
            goto LAB_00108ca6;
          }
          local_2d8._8_4_ = extraout_XMM0_Dc_00;
          local_2d8._0_8_ = dVar18;
          local_2d8._12_4_ = extraout_XMM0_Dd_00;
          if (*piVar7 == 0) goto LAB_001080e5;
          if (*piVar7 == 0x22) {
            std::__throw_out_of_range("stod");
            goto LAB_00108d07;
          }
LAB_001080e8:
          if ((undefined1 *)CONCAT71(local_238._1_7_,local_238[0]) != local_238 + 0x10) {
            operator_delete((undefined1 *)CONCAT71(local_238._1_7_,local_238[0]),
                            local_238._16_8_ + 1);
          }
        }
      }
      else {
        if (7 < iVar6 - 0x61U) goto LAB_00108cd6;
        local_2d8._8_8_ = uVar19;
        local_2d8._0_8_ = dVar18;
        switch(iVar6) {
        case 0x61:
          std::__cxx11::string::string((string *)local_238,(char *)_optarg,(allocator *)&local_328);
          pp_Var1 = (_func_int **)CONCAT71(local_238._1_7_,local_238[0]);
          piVar7 = __errno_location();
          iVar6 = *piVar7;
          *piVar7 = 0;
          dVar18 = strtod((char *)pp_Var1,(char **)&local_2c0);
          local_248._8_4_ = extraout_XMM0_Dc;
          local_248._0_8_ = dVar18;
          local_248._12_4_ = extraout_XMM0_Dd;
          if (local_2c0.super_Display._vptr_Display == pp_Var1) goto LAB_00108cca;
          if (*piVar7 == 0) goto LAB_001080e5;
          if (*piVar7 != 0x22) goto LAB_001080e8;
LAB_00108d13:
          std::__throw_out_of_range("stod");
          goto LAB_00108d1f;
        default:
          goto LAB_00108cd6;
        case 100:
          local_308 = _optarg;
          break;
        case 0x67:
          local_288 = CONCAT71((int7)((ulong)(&DAT_00115040 +
                                             *(int *)(&DAT_00115040 + (ulong)(iVar6 - 0x61U) * 4))
                                     >> 8),1);
          break;
        case 0x68:
          usage(*argv);
        }
      }
      iVar6 = getopt_long(argc,argv,"ghva:d:r:u:x:y:",opts,0);
      dVar18 = (double)local_2d8._0_8_;
      uVar19 = local_2d8._8_8_;
    } while (0 < iVar6);
    pFVar12 = local_308;
    lVar11 = local_2a0;
  }
  if ((90.0 < ABS((double)local_258._0_8_)) || (180.0 < ABS((double)local_2d8._0_8_))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[-] Invalid coordinates (latitude: ",0x23);
    poVar14 = std::ostream::_M_insert<double>((double)local_258._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,", longitude: ",0xd);
    poVar14 = std::ostream::_M_insert<double>((double)local_2d8._0_8_);
    local_238[0] = (string)0x29;
    plVar16 = (long *)std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_238,1);
    lVar11 = *plVar16;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[+] Using viewer position (latitude: ",0x25);
    poVar14 = std::ostream::_M_insert<double>((double)local_258._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,", longitude: ",0xd);
    poVar14 = std::ostream::_M_insert<double>((double)local_2d8._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,", altitude: ",0xc);
    poVar14 = std::ostream::_M_insert<double>((double)local_248._0_8_);
    local_238[0] = (string)0x29;
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_238,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    if (pFVar12 != (FILE *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[+] Using database: ",0x14);
      sVar8 = strlen((char *)pFVar12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)pFVar12,sVar8);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      DBSQLite::DBSQLite((DBSQLite *)&local_298,(char *)pFVar12);
      bVar4 = DBSQLite::ok((DBSQLite *)&local_298);
      if (bVar4) {
        if (local_300 != (FILE *)0x0) {
          iVar6 = (**(code **)(local_298._M_allocated_capacity + 0x10))();
          if ((char)iVar6 == '\0') {
LAB_00108d1f:
            __assert_fail("sourceFile && db.ok() && \"Invalid input to update.\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/enferex[P]satnow/main.cc"
                          ,0xb8,"void update(const char *, DB &, bool)");
          }
          local_2c0.super_Display._vptr_Display = (_func_int **)&local_2b0;
          local_2c0._refreshSecs = 0;
          local_2c0._12_4_ = 0;
          local_2b0 = 0;
          local_2a0 = lVar11;
          std::ifstream::ifstream((istream *)local_238,(char *)local_300,_S_in);
          local_278._M_allocated_capacity = 0;
          local_278._8_8_ = (long *)0x0;
          local_268 = 0;
          while( true ) {
            cVar5 = std::ios::widen((char)*(undefined8 *)
                                           (CONCAT71(local_238._1_7_,local_238[0]) + -0x18) +
                                    (char)(istream *)local_238);
            piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)local_238,(string *)&local_2c0,cVar5);
            uVar2 = local_278._8_8_;
            uVar19 = local_278._M_allocated_capacity;
            if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
            uVar10 = std::__cxx11::string::find_first_not_of((char *)&local_2c0,0x11575d,0);
            if (((uVar10 != 0xffffffffffffffff) &&
                (lVar11 = std::__cxx11::string::find_last_not_of
                                    ((char *)&local_2c0,0x11575c,0xffffffffffffffff), lVar11 != -1))
               && (lVar11 + 1U != uVar10 &&
                   *(char *)((long)local_2c0.super_Display._vptr_Display + uVar10) != '#')) {
              std::__cxx11::string::find_first_of((char *)&local_2c0,0x11575c,uVar10);
              std::__cxx11::string::substr((ulong)&local_328,(ulong)&local_2c0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"[+] Loading TLEs from \'",0x17);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,local_328._M_dataplus._M_p,
                                   CONCAT44(local_328._M_string_length._4_4_,
                                            (uint)local_328._M_string_length));
              local_2f8[0] = 0x27;
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_2f8,1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
              std::ostream::put((char)poVar14);
              std::ostream::flush();
              lVar11 = std::__cxx11::string::find((char *)&local_328,0x1157e9,0);
              if ((lVar11 == -1) &&
                 (pFVar12 = fopen(local_328._M_dataplus._M_p,"r"), pFVar12 != (FILE *)0x0)) {
                readTLEs((vector<Tle,_std::allocator<Tle>_> *)local_2f8,&local_328,(FILE *)pFVar12);
                std::vector<Tle,std::allocator<Tle>>::
                _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<Tle*,std::vector<Tle,std::allocator<Tle>>>>>
                          ((vector<Tle,std::allocator<Tle>> *)&local_278,local_278._8_8_,
                           local_2f8._0_8_,local_2f8._8_8_);
                fclose(pFVar12);
                std::vector<Tle,_std::allocator<Tle>_>::~vector
                          ((vector<Tle,_std::allocator<Tle>_> *)local_2f8);
              }
              else {
                lVar11 = curl_easy_init();
                if (((lVar11 != 0) &&
                    ((iVar6 = curl_easy_setopt(lVar11,0x2712,local_328._M_dataplus._M_p), iVar6 == 0
                     && (lVar13 = std::__cxx11::string::find((char *)&local_328,0x1157e9,0),
                        lVar13 != -1)))) && (local_308 = tmpfile(), local_308 != (FILE *)0x0)) {
                  iVar6 = curl_easy_setopt(lVar11,0x2711,local_308);
                  if (iVar6 == 0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"[+] Downloading contents from ",0x1e);
                    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,local_328._M_dataplus._M_p,
                                         CONCAT44(local_328._M_string_length._4_4_,
                                                  (uint)local_328._M_string_length));
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14)
                    ;
                    std::ostream::put((char)poVar14);
                    std::ostream::flush();
                    iVar6 = curl_easy_perform(lVar11);
                    curl_easy_cleanup(lVar11);
                    pFVar12 = local_308;
                    rewind(local_308);
                    readTLEs((vector<Tle,_std::allocator<Tle>_> *)local_2f8,&local_328,
                             (FILE *)pFVar12);
                    std::vector<Tle,std::allocator<Tle>>::
                    _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<Tle*,std::vector<Tle,std::allocator<Tle>>>>>
                              ((vector<Tle,std::allocator<Tle>> *)&local_278,local_278._8_8_,
                               local_2f8._0_8_,local_2f8._8_8_);
                    fclose(local_308);
                    std::vector<Tle,_std::allocator<Tle>_>::~vector
                              ((vector<Tle,_std::allocator<Tle>_> *)local_2f8);
                    if (iVar6 == 0) goto LAB_00108646;
                  }
                  else {
                    fclose(local_308);
                    curl_easy_cleanup(lVar11);
                  }
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"[-] Unknown entry in ",0x15);
                pFVar12 = local_300;
                sVar8 = strlen((char *)local_300);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(char *)pFVar12,sVar8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," Line ",6)
                ;
                poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
                std::ostream::put((char)poVar14);
                std::ostream::flush();
              }
LAB_00108646:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != &local_328.field_2) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
            }
          }
          for (; uVar19 != uVar2; uVar19 = (long *)(uVar19 + 0xd8)) {
            (**(code **)(local_298._M_allocated_capacity + 8))(&local_298,uVar19);
            if ((local_280 & 1) != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"[+] Refreshing [",0x10);
              poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              local_328._M_dataplus._M_p._0_1_ = 0x2f;
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,(char *)&local_328,1);
              poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"]: ",3);
              __val = *(uint *)(uVar19 + 0xd0);
              cVar5 = '\x01';
              if (9 < __val) {
                uVar15 = __val;
                cVar3 = '\x04';
                do {
                  cVar5 = cVar3;
                  if (uVar15 < 100) {
                    cVar5 = cVar5 + -2;
                    goto LAB_00108a3e;
                  }
                  if (uVar15 < 1000) {
                    cVar5 = cVar5 + -1;
                    goto LAB_00108a3e;
                  }
                  if (uVar15 < 10000) goto LAB_00108a3e;
                  bVar4 = 99999 < uVar15;
                  uVar15 = uVar15 / 10000;
                  cVar3 = cVar5 + '\x04';
                } while (bVar4);
                cVar5 = cVar5 + '\x01';
              }
LAB_00108a3e:
              local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_328,cVar5);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_328._M_dataplus._M_p,(uint)local_328._M_string_length,__val);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,local_328._M_dataplus._M_p,
                                   CONCAT44(local_328._M_string_length._4_4_,
                                            (uint)local_328._M_string_length));
              std::__ostream_insert<char,std::char_traits<char>>(poVar14," (",2);
              local_2f8._0_8_ = local_2f8 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_2f8,*(long *)uVar19,*(long *)(uVar19 + 8) + *(long *)uVar19
                        );
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,(char *)local_2f8._0_8_,local_2f8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
              iVar6 = (**(code **)(local_298._M_allocated_capacity + 0x10))(&local_298);
              pcVar17 = "Failed";
              if ((byte)iVar6 != 0) {
                pcVar17 = "Good";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,pcVar17,(ulong)(byte)((byte)iVar6 ^ 1) * 2 + 4);
              local_329 = ']';
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,&local_329,1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
              std::ostream::put((char)poVar14);
              std::ostream::flush();
              if ((pointer)local_2f8._0_8_ != (pointer)(local_2f8 + 0x10)) {
                operator_delete((void *)local_2f8._0_8_,
                                (ulong)((long)&(((string *)local_2f8._16_8_)->_M_dataplus)._M_p + 1)
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != &local_328.field_2) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
            }
          }
          std::vector<Tle,_std::allocator<Tle>_>::~vector
                    ((vector<Tle,_std::allocator<Tle>_> *)&local_278);
          std::ifstream::~ifstream(local_238);
          lVar11 = local_2a0;
          if (local_2c0.super_Display._vptr_Display != (_func_int **)&local_2b0) {
            operator_delete(local_2c0.super_Display._vptr_Display,CONCAT71(uStack_2af,local_2b0) + 1
                           );
            lVar11 = local_2a0;
          }
        }
        getSatellitesAndLookAngles
                  ((SatLookAngles *)local_238,(double)local_258._0_8_,(double)local_2d8._0_8_,
                   (double)local_248._0_8_,(DB *)&local_298._M_allocated_capacity);
        if ((local_288 & 1) == 0) {
          local_2c0.super_Display._vptr_Display = (_func_int **)&PTR_render_0011ac00;
          DisplayConsole::render((DisplayConsole *)&local_2c0,(SatLookAngles *)local_238);
        }
        else {
          DisplayNCurses::DisplayNCurses(&local_2c0,(int)lVar11);
          DisplayNCurses::render(&local_2c0,(SatLookAngles *)local_238);
          DisplayNCurses::~DisplayNCurses(&local_2c0);
        }
        std::
        vector<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
        ::~vector(local_220);
        iVar6 = 0;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"[-] Error opening database \'",0x1c);
        sVar8 = strlen((char *)pFVar12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(char *)pFVar12,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\': ",3);
        DBSQLite::getErrorString_abi_cxx11_((string *)local_238,(DBSQLite *)&local_298);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(char *)CONCAT71(local_238._1_7_,local_238[0]),
                             local_238._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
        if ((undefined1 *)CONCAT71(local_238._1_7_,local_238[0]) != local_238 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_238._1_7_,local_238[0]),local_238._16_8_ + 1)
          ;
        }
        iVar6 = 1;
      }
      DBSQLite::~DBSQLite((DBSQLite *)&local_298);
      return iVar6;
    }
    plVar16 = &std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[-] The database path must not be empty (see --help).",0x35);
    lVar11 = std::cerr;
  }
  std::ios::widen((char)*(undefined8 *)(lVar11 + -0x18) + (char)plVar16);
  std::ostream::put((char)plVar16);
  std::ostream::flush();
  return 1;
}

Assistant:

int main(int argc, char **argv) {
  double alt = 0.0, lat = 0.0, lon = 0.0;
  bool verbose = false, gui = false;
  const char *sourceFile = nullptr, *dbFile = DEFAULT_DB_PATH;
  int opt, refreshRate = -1;
  const char *optStr = "ghva:d:r:u:x:y:";
  while ((opt = getopt_long(argc, argv, optStr, opts, nullptr)) > 0) {
    switch (opt) {
#if HAVE_GUI
    case 'g':
      gui = true;
      break;
    case 'r':
      refreshRate = std::stoi(optarg);
      break;
#endif
    case 'h':
      usage(argv[0]);
      break;
    case 'v':
      verbose = true;
      break;
    case 'a':
      alt = std::stod(optarg);
      break;
    case 'd':
      dbFile = optarg;
      break;
    case 'u':
      sourceFile = optarg;
      break;
    case 'x':
      lat = std::stod(optarg);
      break;
    case 'y':
      lon = std::stod(optarg);
      break;
    default:
      std::cerr << "[-] Unknown command line option." << std::endl;
      exit(EXIT_FAILURE);
      break;
    }
  }

  // Ensure we have valid coords.
  if (lat > 90.0 || lat < -90.0 || lon > 180.0 || lon < -180.0) {
    std::cerr << "[-] Invalid coordinates (latitude: " << lat
              << ", longitude: " << lon << ')' << std::endl;
    return EXIT_FAILURE;
  }
  std::cout << "[+] Using viewer position (latitude: " << lat
            << ", longitude: " << lon << ", "
            << ", altitude: " << alt << ')' << std::endl;

  // Open the database that contains the TLE data.
  if (!dbFile) {
    std::cerr << "[-] The database path must not be empty (see --help)."
              << std::endl;
    return EXIT_FAILURE;
  }
  std::cout << "[+] Using database: " << dbFile << std::endl;

  DBSQLite db(dbFile);
  if (!db.ok()) {
    std::cerr << "[-] Error opening database '" << dbFile
              << "': " << db.getErrorString() << std::endl;
    return EXIT_FAILURE;
  }

  // If a source file is specified, then update the existing database.
  if (sourceFile)
    update(sourceFile, db, verbose);

  // Calculate and display.
  auto TLEsAndLAs = getSatellitesAndLookAngles(lat, lon, alt, db);
  if (gui) {
    DisplayNCurses disp(refreshRate);
    disp.render(TLEsAndLAs);
  } else {
    DisplayConsole disp;
    disp.render(TLEsAndLAs);
  }

  return 0;
}